

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-randart.c
# Opt level: O1

void design_artifact(artifact_set_data *data,wchar_t tv,int *aidx)

{
  bitflag *flags1;
  _Bool **dest;
  element_info *peVar1;
  int iVar2;
  bool bVar3;
  _Bool _Var4;
  int16_t iVar5;
  uint32_t uVar6;
  wchar_t wVar7;
  int iVar8;
  uint32_t uVar9;
  uint uVar10;
  uint uVar11;
  wchar_t wVar12;
  object_kind *poVar13;
  artifact *a_dst;
  char *pcVar14;
  char *pcVar15;
  long lVar16;
  int *piVar17;
  ulong uVar18;
  object_kind *poVar19;
  wchar_t *pwVar20;
  _Bool verbose;
  undefined1 extraout_DL;
  undefined1 extraout_DL_00;
  undefined1 uVar21;
  _Bool verbose_00;
  wchar_t wVar22;
  wchar_t extraout_EDX;
  undefined8 uVar23;
  wchar_t temp;
  wchar_t wVar24;
  uint uVar25;
  short sVar26;
  uint uVar27;
  ulong uVar28;
  element_info *peVar29;
  int16_t *piVar30;
  artifact *a;
  long lVar31;
  uint uVar32;
  uint uVar33;
  brand_conflict *pbVar34;
  artifact *paVar35;
  bool bVar36;
  byte bVar37;
  random_value v;
  wchar_t local_364;
  wchar_t local_330;
  int local_328 [96];
  wchar_t art_freq [94];
  
  paVar35 = a_info;
  bVar37 = 0;
  iVar8 = *aidx;
  poVar13 = lookup_kind(a_info[iVar8].tval,a_info[iVar8].sval);
  local_364 = paVar35[iVar8].level;
  if (tv == L'\0') {
    uVar6 = Rand_div(data->tv_freq[0x23]);
    tv = L'\xffffffff';
    piVar17 = data->tv_freq;
    do {
      tv = tv + L'\x01';
      iVar2 = *piVar17;
      piVar17 = piVar17 + 1;
    } while (iVar2 <= (int)uVar6);
  }
  paVar35 = paVar35 + iVar8;
  a_dst = (artifact *)mem_zalloc(0x140);
  a = (artifact *)(ulong)(uint)data->avg_tv_power[tv];
  wVar7 = Rand_sample(data->avg_tv_power[tv],data->max_tv_power[tv],data->min_tv_power[tv],0x14,0x14
                     );
  pcVar14 = artifact_gen_name(a,name_sections);
  while ((pcVar15 = strstr(paVar35->name,"The One Ring"), pcVar15 != (char *)0x0 ||
         (_Var4 = flag_has_dbg(poVar13->kind_flags,2,5,"kind->kind_flags","KF_QUEST_ART"), _Var4)))
  {
    lVar16 = (long)*aidx + 1;
    *aidx = (int)lVar16;
    if ((int)(uint)z_info->a_max <= (int)lVar16) {
      string_free(pcVar14);
      mem_free(a_dst);
      return;
    }
    paVar35 = a_info + lVar16;
    local_364 = a_info[lVar16].level;
  }
  string_free(paVar35->name);
  paVar35->name = pcVar14;
  file_putf(log_file,">>>>>>>>>>>>>>>>>>>>>>>>>> CREATING NEW ARTIFACT\n");
  file_putf(log_file,"Artifact %d: power = %d\n",(ulong)(uint)*aidx,(ulong)(uint)wVar7);
  wVar12 = -wVar7;
  if (L'\0' < wVar7) {
    wVar12 = wVar7;
  }
  flags1 = paVar35->flags;
  dest = &paVar35->brands;
  wVar22 = (uint)(wVar12 * 6) / 10 + L'\x01';
  if (wVar22 <= wVar12 + L'\xffffffec') {
    wVar22 = wVar12 + L'\xffffffec';
  }
  uVar10 = 0;
  do {
    if (tv == L'\0') {
      uVar6 = Rand_div(data->tv_freq[0x23]);
      tv = L'\xffffffff';
      piVar17 = data->tv_freq;
      do {
        tv = tv + L'\x01';
        iVar8 = *piVar17;
        piVar17 = piVar17 + 1;
      } while (iVar8 <= (int)uVar6);
    }
    local_328[0x18] = 0;
    local_328[0x19] = 0;
    local_328[0x1a] = 0;
    local_328[0x1b] = 0;
    local_328[0x14] = 0;
    local_328[0x15] = 0;
    local_328[0x16] = 0;
    local_328[0x17] = 0;
    local_328[0x10] = 0;
    local_328[0x11] = 0;
    local_328[0x12] = 0;
    local_328[0x13] = 0;
    local_328[0xc] = 0;
    local_328[0xd] = 0;
    local_328[0xe] = 0;
    local_328[0xf] = 0;
    local_328[8] = 0;
    local_328[9] = 0;
    local_328[10] = 0;
    local_328[0xb] = 0;
    local_328[4] = 0;
    local_328[5] = 0;
    local_328[6] = 0;
    local_328[7] = 0;
    local_328[0] = 0;
    local_328[1] = 0;
    local_328[2] = 0;
    local_328[3] = 0;
    local_328[0x1c] = 0;
    local_328[0x1d] = 0;
    wVar24 = L'\x01';
    if ((tv & 0xfffffffeU) == 0x14) {
      wVar24 = L'\x01';
      poVar13 = lookup_kind(tv,L'\x01');
      if (poVar13->kidx < (uint)z_info->ordinary_kind_max) {
        wVar24 = L'\x01';
        do {
          wVar24 = wVar24 + L'\x01';
          poVar13 = lookup_kind(tv,wVar24);
        } while (poVar13->kidx < (uint)z_info->ordinary_kind_max);
      }
    }
    do {
      uVar6 = Rand_div((kb_info[tv].num_svals - wVar24) + 1);
      poVar13 = lookup_kind(tv,uVar6 + wVar24);
      pcVar14 = strstr(poVar13->name,"Ring of");
      if ((pcVar14 != (char *)0x0) ||
         (_Var4 = flag_has_dbg(poVar13->kind_flags,2,5,"kind->kind_flags","KF_QUEST_ART"), _Var4)) {
        poVar13 = (object_kind *)0x0;
      }
    } while (poVar13 == (object_kind *)0x0);
    object_short_name((char *)local_328,0x78,poVar13->name);
    file_putf(log_file,"Creating %s\n",local_328);
    paVar35->tval = poVar13->tval;
    paVar35->sval = poVar13->sval;
    wVar24 = randcalc(poVar13->to_h,0,MINIMISE);
    paVar35->to_h = wVar24;
    wVar24 = randcalc(poVar13->to_d,0,MINIMISE);
    paVar35->to_d = wVar24;
    wVar24 = randcalc(poVar13->to_a,0,MINIMISE);
    paVar35->to_a = wVar24;
    paVar35->ac = poVar13->ac;
    paVar35->dd = poVar13->dd;
    paVar35->ds = poVar13->ds;
    paVar35->weight = poVar13->weight;
    flag_copy(flags1,poVar13->flags,5);
    mem_free(paVar35->slays);
    paVar35->slays = (_Bool *)0x0;
    copy_slays(&paVar35->slays,poVar13->slays);
    mem_free(paVar35->brands);
    paVar35->brands = (_Bool *)0x0;
    copy_brands(dest,poVar13->brands);
    mem_free(paVar35->curses);
    paVar35->curses = (int *)0x0;
    if (poVar13->curses != (int *)0x0) {
      piVar17 = (int *)mem_alloc((ulong)z_info->curse_max << 2);
      paVar35->curses = piVar17;
      memcpy(piVar17,poVar13->curses,(ulong)z_info->curse_max << 2);
    }
    paVar35->activation = (activation *)0x0;
    string_free(paVar35->alt_msg);
    paVar35->alt_msg = (char *)0x0;
    if (poVar13->activation == (activation *)0x0) {
      if (poVar13->effect != (effect *)0x0) {
        wVar24 = poVar13->level;
        goto LAB_0019834b;
      }
      paVar35->level = L'\0';
    }
    else {
      wVar24 = poVar13->activation->level;
LAB_0019834b:
      paVar35->level = wVar24;
    }
    (paVar35->time).base = 0;
    (paVar35->time).dice = 0;
    (paVar35->time).sides = 0;
    (paVar35->time).m_bonus = 0;
    lVar16 = 0;
    do {
      v._8_8_ = *(undefined8 *)(&poVar13->modifiers[0].sides + lVar16);
      v._0_8_ = *(undefined8 *)(&poVar13->modifiers[0].base + lVar16);
      iVar8 = randcalc(v,0,MINIMISE);
      *(int *)((long)paVar35->modifiers + lVar16) = iVar8;
      lVar16 = lVar16 + 4;
    } while (lVar16 != 0x40);
    lVar16 = 0;
    do {
      paVar35->el_info[lVar16] = poVar13->el_info[lVar16];
      lVar16 = lVar16 + 1;
    } while (lVar16 != 0x19);
    lVar16 = 0x92;
    do {
      paVar35->flags[lVar16 + -0x48] = paVar35->flags[lVar16 + -0x48] | 2;
      lVar16 = lVar16 + 4;
    } while (lVar16 != 0xa2);
    iVar8 = poVar13->tval;
    if (iVar8 - 10U < 9) {
      uVar6 = data->ac_startval;
      uVar9 = Rand_div(uVar6);
      paVar35->to_a =
           (int)(short)((short)uVar9 + (short)(uVar6 - ((int)uVar6 >> 0x1f) >> 1)) + paVar35->to_a;
      file_putf(log_file,"Assigned basic stats, AC bonus: %d\n");
    }
    else if (iVar8 - 5U < 5) {
      uVar6 = data->hit_startval;
      uVar9 = Rand_div(uVar6);
      paVar35->to_h =
           paVar35->to_h + (int)(short)((short)uVar9 + (short)(uVar6 - ((int)uVar6 >> 0x1f) >> 1));
      uVar6 = data->dam_startval;
      uVar9 = Rand_div(uVar6);
      paVar35->to_d =
           (int)(short)((short)uVar9 + (short)(uVar6 - ((int)uVar6 >> 0x1f) >> 1)) + paVar35->to_d;
      file_putf(log_file,"Assigned basic stats, to_hit: %d, to_dam: %d\n",(ulong)(uint)paVar35->to_h
               );
    }
    else if (iVar8 == 0x13) {
      flag_off(flags1,5,0x14);
      flag_off(flags1,5,0x13);
      flag_on_dbg(flags1,5,0x15,"art->flags","OF_NO_FUEL");
      if ((uint)z_info->ordinary_kind_max <= poVar13->kidx) {
        paVar35->modifiers[0xd] = L'\x03';
      }
    }
    poVar13 = lookup_kind(paVar35->tval,paVar35->sval);
    wVar24 = artifact_power(*aidx,"for base item power",verbose);
    file_putf(log_file,"Base item power %d\n",(ulong)(uint)wVar24);
    if (wVar24 <= wVar22) goto LAB_00198568;
    file_putf(log_file,"Power too high!\n");
    uVar10 = uVar10 + 1;
  } while (uVar10 != 200);
  uVar10 = 200;
LAB_00198568:
  if (199 < uVar10) {
    file_putf(log_file,"Warning! Couldn\'t get appropriate power level on base item.\n");
  }
  memset(local_328,0,0x178);
  memset(art_freq,0,0x178);
  wVar22 = paVar35->tval;
  if (wVar22 == L'\x05') {
    piVar17 = data->art_probs;
    lVar16 = 0;
    do {
      local_328[*(short *)((long)art_idx_bow + lVar16)] =
           piVar17[*(short *)((long)art_idx_bow + lVar16)];
      lVar16 = lVar16 + 2;
    } while (lVar16 != 8);
  }
  piVar17 = data->art_probs;
  if ((uint)(wVar22 + L'\xfffffffb') < 5) {
    lVar16 = 0;
    do {
      local_328[*(short *)((long)art_idx_weapon + lVar16)] =
           piVar17[*(short *)((long)art_idx_weapon + lVar16)];
      lVar16 = lVar16 + 2;
    } while (lVar16 != 6);
  }
  else {
    lVar16 = 0;
    do {
      local_328[*(short *)((long)art_idx_nonweapon + lVar16)] =
           piVar17[*(short *)((long)art_idx_nonweapon + lVar16)];
      lVar16 = lVar16 + 2;
    } while (lVar16 != 0x10);
  }
  if ((uint)(wVar22 + L'\xfffffffa') < 4) {
    piVar17 = data->art_probs;
    lVar16 = 0;
    do {
      local_328[*(short *)((long)art_idx_melee + lVar16)] =
           piVar17[*(short *)((long)art_idx_melee + lVar16)];
      lVar16 = lVar16 + 2;
    } while (lVar16 != 0x12);
  }
  if ((uint)(wVar22 + L'\xfffffff6') < 9) {
    local_328[0x16] = data->art_probs[0x16];
  }
  if (wVar22 == L'\v') {
    piVar17 = data->art_probs;
    lVar16 = 0;
    do {
      local_328[*(short *)((long)art_idx_glove + lVar16)] =
           piVar17[*(short *)((long)art_idx_glove + lVar16)];
      lVar16 = lVar16 + 2;
    } while (lVar16 != 8);
  }
  else if (wVar22 == L'\n') {
    piVar17 = data->art_probs;
    lVar16 = 0;
    do {
      local_328[*(short *)((long)art_idx_boot + lVar16)] =
           piVar17[*(short *)((long)art_idx_boot + lVar16)];
      lVar16 = lVar16 + 2;
    } while (lVar16 != 0xc);
  }
  if ((wVar22 & 0xfffffffeU) == 0xc) {
    piVar17 = data->art_probs;
    lVar16 = 0;
    do {
      local_328[*(short *)((long)art_idx_headgear + lVar16)] =
           piVar17[*(short *)((long)art_idx_headgear + lVar16)];
      lVar16 = lVar16 + 2;
    } while (lVar16 != 0xc);
  }
  if (wVar22 == L'\x0f') {
    piVar17 = data->art_probs;
    lVar16 = 0;
    do {
      local_328[*(short *)((long)art_idx_cloak + lVar16)] =
           piVar17[*(short *)((long)art_idx_cloak + lVar16)];
      lVar16 = lVar16 + 2;
    } while (lVar16 == 2);
  }
  else if (wVar22 == L'\x0e') {
    piVar17 = data->art_probs;
    lVar16 = 0;
    do {
      local_328[*(short *)((long)art_idx_shield + lVar16)] =
           piVar17[*(short *)((long)art_idx_shield + lVar16)];
      lVar16 = lVar16 + 2;
    } while (lVar16 == 2);
  }
  if ((uint)(wVar22 + L'\xfffffff0') < 3) {
    piVar17 = data->art_probs;
    lVar16 = 0;
    do {
      local_328[*(short *)((long)art_idx_armor + lVar16)] =
           piVar17[*(short *)((long)art_idx_armor + lVar16)];
      lVar16 = lVar16 + 2;
    } while (lVar16 != 0xe);
  }
  piVar17 = data->art_probs;
  lVar16 = 0;
  do {
    local_328[*(short *)((long)art_idx_gen + lVar16)] =
         piVar17[*(short *)((long)art_idx_gen + lVar16)];
    lVar16 = lVar16 + 2;
  } while (lVar16 != 0x46);
  uVar18 = 0xffffffffffffffff;
  lVar16 = 0;
  do {
    iVar8 = local_328[lVar16];
    uVar28 = uVar18;
    do {
      art_freq[uVar28 + 1] = art_freq[uVar28 + 1] + iVar8;
      uVar28 = uVar28 + 1;
    } while (uVar28 < 0x5d);
    lVar16 = lVar16 + 1;
    uVar18 = uVar18 + 1;
  } while (lVar16 != 0x5e);
  uVar18 = 0;
  do {
    file_putf(log_file,"Cumulative frequency of ability %d is: %d\n",uVar18 & 0xffffffff,
              (ulong)(uint)art_freq[uVar18]);
    uVar18 = uVar18 + 1;
  } while (uVar18 != 0x5e);
  copy_artifact(paVar35,a_dst);
  if ((uint)(paVar35->tval + L'\xfffffffa') < 4) {
    uVar6 = Rand_div((uint)z_info->a_max);
    if ((int)uVar6 < data->art_probs[0x57]) {
      uVar6 = Rand_div(4);
      wVar22 = uVar6 + paVar35->dd + L'\x03';
      uVar18 = (ulong)(uint)wVar22;
      paVar35->dd = wVar22;
      pcVar14 = "Supercharging damage dice!  (Now %d dice)\n";
    }
    else {
      uVar6 = Rand_div((uint)z_info->a_max);
      if (data->art_probs[0x5b] <= (int)uVar6) goto LAB_001988fa;
      paVar35->modifiers[10] = L'\x02';
      pcVar14 = "Supercharging melee blows! (%+d blows)\n";
      uVar18 = 2;
    }
    file_putf(log_file,pcVar14,uVar18);
  }
LAB_001988fa:
  if (paVar35->tval == L'\x05') {
    uVar6 = Rand_div((uint)z_info->a_max);
    if ((int)uVar6 < data->art_probs[0x58]) {
      paVar35->modifiers[0xb] = L'\x14';
      pcVar14 = "Supercharging shots! (%+d extra shots)\n";
      uVar23 = 0x14;
    }
    else {
      uVar6 = Rand_div((uint)z_info->a_max);
      if (data->art_probs[0x59] <= (int)uVar6) goto LAB_0019897f;
      paVar35->modifiers[0xc] = L'\x03';
      pcVar14 = "Supercharging might! (%+d extra might)\n";
      uVar23 = 3;
    }
    file_putf(log_file,pcVar14,uVar23);
  }
LAB_0019897f:
  uVar6 = Rand_div((uint)z_info->a_max);
  if (((int)uVar6 < data->art_probs[0x5a]) ||
     ((paVar35->tval == L'\n' &&
      (uVar6 = Rand_div((uint)z_info->a_max), (int)uVar6 < data->art_probs[0x1b])))) {
    uVar6 = Rand_div(6);
    paVar35->modifiers[9] = uVar6 + L'\x05';
    uVar6 = Rand_div(2);
    if (uVar6 == 0) {
      uVar6 = Rand_div(3);
      paVar35->modifiers[9] = uVar6 + paVar35->modifiers[9] + L'\x01';
    }
    uVar6 = Rand_div(6);
    if (uVar6 == 0) {
      uVar6 = Rand_div(6);
      paVar35->modifiers[9] = uVar6 + paVar35->modifiers[9] + L'\x02';
    }
    file_putf(log_file,"Supercharging speed for this item!  (New speed bonus is %d)\n",
              (ulong)(uint)paVar35->modifiers[9]);
  }
  if ((uint)(paVar35->tval + L'\xfffffffa') < 4) {
    uVar6 = Rand_div((uint)z_info->a_max);
    if ((int)uVar6 < data->art_probs[0x5c]) {
LAB_00198aa6:
      uVar6 = Rand_div(0xb);
      pwVar20 = &paVar35->to_a;
      paVar35->to_a = uVar6 + paVar35->to_a + L'\x14';
      uVar6 = Rand_div(2);
      if (uVar6 == 0) {
        uVar6 = Rand_div(10);
        *pwVar20 = uVar6 + *pwVar20 + L'\x01';
      }
      uVar6 = Rand_div(6);
      if (uVar6 == 0) {
        uVar6 = Rand_div(0x14);
        *pwVar20 = uVar6 + *pwVar20 + L'\x01';
      }
      file_putf(log_file,"Supercharging AC! New AC bonus is %d\n",(ulong)(uint)*pwVar20);
    }
  }
  else if ((paVar35->tval != L'\x05') &&
          (uVar6 = Rand_div((uint)z_info->a_max), (int)uVar6 < data->art_probs[0x5d]))
  goto LAB_00198aa6;
  wVar22 = paVar35->tval;
  uVar6 = Rand_div((uint)z_info->a_max);
  uVar21 = extraout_DL;
  if ((uint)(wVar22 + L'\xfffffffb') < 5) {
    if ((uint)wVar12 < 0x12d) goto LAB_00198b9d;
    iVar8 = data->art_probs[0x55];
  }
  else {
    if ((uint)wVar12 < 0x12d) goto LAB_00198b9d;
    iVar8 = data->art_probs[0x56];
  }
  if ((int)uVar6 < iVar8) {
    flag_on_dbg(flags1,5,0x1a,"art->flags","OF_AGGRAVATE");
    file_putf(log_file,"Adding aggravation\n");
    uVar21 = extraout_DL_00;
  }
LAB_00198b9d:
  wVar22 = artifact_power(*aidx,"result of supercharge",(_Bool)uVar21);
  wVar24 = (uint)(wVar12 * 0x17) / 0x14 + L'\x01';
  if (wVar24 < wVar22) {
    copy_artifact(a_dst,paVar35);
    file_putf(log_file,"--- Supercharge is too powerful! Rolling back.\n");
  }
  uVar10 = data->neg_power_total;
  if ((int)uVar10 < 3) {
    uVar10 = 2;
  }
  uVar6 = Rand_div(z_info->a_max / uVar10);
  uVar10 = 1;
  if (uVar6 != 0) {
    uVar10 = (uint)wVar7 >> 0x1f;
  }
  peVar1 = paVar35->el_info;
  local_330 = (uint)(wVar12 * 0x13) / 0x14;
  uVar11 = 0;
  do {
    copy_artifact(paVar35,a_dst);
    wVar7 = Rand_div(art_freq[0x5d]);
    uVar25 = 0xffffffff;
    pwVar20 = art_freq;
    do {
      uVar25 = uVar25 + 1;
      wVar22 = *pwVar20;
      pwVar20 = pwVar20 + 1;
    } while (wVar22 <= wVar7);
    file_putf(log_file,"Ability chosen was number: %d\n",(ulong)uVar25);
    poVar19 = lookup_kind(paVar35->tval,paVar35->sval);
    wVar7 = L'\x0026fd70';
    switch(uVar25) {
    case 0:
    case 0xc:
      wVar7 = L'\v';
      goto LAB_0019981c;
    case 1:
      wVar7 = L'\f';
      goto LAB_0019981c;
    case 2:
    case 9:
    case 0xe:
      if ((*dest == (_Bool *)0x0) || (uVar6 = Rand_div(4), uVar6 == 0)) {
        iVar8 = 199;
        pbVar34 = (brand_conflict *)0x0;
        do {
          uVar6 = Rand_div(z_info->brand_max - 1);
          wVar7 = uVar6 + L'\x01';
          _Var4 = append_brand(dest,wVar7);
          if (_Var4) {
            pbVar34 = brands + wVar7;
            file_putf(log_file,"Adding brand: %sx%d\n",brands[wVar7].name,
                      (ulong)(uint)brands[wVar7].multiplier);
          }
          bVar36 = iVar8 != 0;
          iVar8 = iVar8 + -1;
        } while (!_Var4 && bVar36);
        if ((pbVar34 != (brand_conflict *)0x0) && (uVar6 = Rand_div(4), uVar6 != 0)) {
          lVar16 = 2;
          peVar29 = peVar1;
          do {
            pcVar14 = *(char **)(&projections->index + lVar16);
            iVar8 = strcmp(pbVar34->name,pcVar14);
            if ((iVar8 == 0) && (peVar29->res_level < 1)) {
              peVar29->res_level = 1;
              file_putf(log_file,"Adding resistance to %s\n",pcVar14);
            }
            peVar29 = peVar29 + 1;
            lVar16 = lVar16 + 0x1a;
          } while (lVar16 != 0x6a);
        }
      }
      break;
    case 3:
    case 10:
    case 0xf:
      add_slay(paVar35);
      break;
    case 4:
    case 6:
      add_to_hit(paVar35,data->hit_increment * 2,L'\x0026fd70');
      break;
    case 5:
    case 7:
      iVar8 = data->dam_increment;
      goto LAB_00198f6a;
    case 8:
    case 0x20:
      add_to_hit(paVar35,data->hit_increment * 2,L'\x0026fd70');
      iVar8 = data->dam_increment;
      wVar7 = extraout_EDX;
LAB_00198f6a:
      add_to_dam(paVar35,iVar8 * 2,wVar7);
      break;
    case 0xb:
    case 0x11:
      wVar7 = L'\n';
      goto LAB_0019981c;
    case 0xd:
      wVar7 = L'\x12';
      goto LAB_00199736;
    case 0x10:
    case 0x24:
    case 0x3d:
      wVar7 = L'\x0e';
      goto LAB_00199736;
    case 0x12:
    case 0x17:
    case 0x1d:
    case 0x21:
    case 0x27:
    case 0x29:
    case 0x2b:
    case 0x4e:
      iVar8 = data->ac_increment;
      if (paVar35->to_a < L'%') {
        if (L'\x1a' < paVar35->to_h) {
          uVar6 = 2;
          goto LAB_00198cf8;
        }
      }
      else {
        uVar6 = 6;
LAB_00198cf8:
        uVar6 = Rand_div(uVar6);
        if (uVar6 != 0) {
          uVar18 = (ulong)(uint)paVar35->to_a;
          pcVar14 = "Failed to add to-AC, value %d is too high\n";
          goto LAB_00199711;
        }
      }
      uVar6 = Rand_div(iVar8 * 2);
      wVar7 = (int)(short)((short)uVar6 + 1) + paVar35->to_a;
      uVar18 = (ulong)(uint)wVar7;
      paVar35->to_a = wVar7;
      pcVar14 = "Adding ability: AC bonus (new bonus is %+d)\n";
      goto LAB_00199711;
    case 0x13:
      uVar6 = Rand_div(2);
      wVar7 = (uVar6 + 1 & 0xff) + paVar35->dd;
      uVar18 = (ulong)(uint)wVar7;
      paVar35->dd = wVar7;
      pcVar14 = "Adding ability: extra damage dice (now %d dice)\n";
      goto LAB_00199711;
    case 0x14:
    case 0x16:
      wVar7 = (paVar35->weight * 9) / 10;
      uVar18 = (ulong)(uint)wVar7;
      paVar35->weight = wVar7;
      pcVar14 = "Adding ability: lower weight (new weight is %d)\n";
LAB_00199711:
      file_putf(log_file,pcVar14,uVar18);
      break;
    case 0x15:
    case 0x4f:
      wVar7 = L'\b';
      goto LAB_0019981c;
    case 0x18:
    case 0x3b:
      wVar7 = L'\v';
      goto LAB_00199736;
    case 0x19:
    case 0x2a:
    case 0x2c:
    case 0x34:
      wVar7 = L'\x05';
      goto LAB_0019981c;
    case 0x1a:
    case 0x54:
      wVar7 = L'$';
      goto LAB_00199736;
    case 0x1b:
    case 0x37:
      wVar7 = L'\t';
      goto LAB_0019981c;
    case 0x1c:
    case 0x53:
      wVar7 = L'\x0f';
      goto LAB_0019981c;
    case 0x1e:
    case 0x39:
      wVar7 = L'\x0f';
      goto LAB_00199736;
    case 0x1f:
      wVar7 = L'\x03';
      goto LAB_0019981c;
    case 0x22:
    case 0x46:
      wVar7 = L'\a';
      goto LAB_00199736;
    case 0x23:
    case 0x3e:
      wVar7 = L'\r';
      goto LAB_00199736;
    case 0x25:
      wVar7 = L'\x02';
      goto LAB_0019981c;
    case 0x26:
      wVar7 = L'\x01';
      goto LAB_0019981c;
    case 0x28:
    case 0x2f:
    case 0x41:
      lVar31 = 0;
      lVar16 = 0;
      do {
        lVar31 = lVar31 + (ulong)(peVar1[lVar16].res_level < 1);
        lVar16 = lVar16 + 1;
      } while (lVar16 != 4);
      if (lVar31 != 0) {
        uVar6 = Rand_div((uint32_t)lVar31);
        lVar16 = 2;
        lVar31 = 0;
        peVar29 = peVar1;
        do {
          if (peVar29->res_level < 1) {
            if (lVar31 == (int)uVar6) {
              peVar29->res_level = 1;
              pcVar14 = *(char **)(&projections->index + lVar16);
              goto LAB_00199bf9;
            }
            lVar31 = lVar31 + 1;
          }
          peVar29 = peVar29 + 1;
          lVar16 = lVar16 + 0x1a;
        } while (lVar16 != 0x6a);
      }
      break;
    case 0x2d:
    case 0x3a:
      wVar7 = L'\x10';
      goto LAB_00199736;
    case 0x2e:
      wVar7 = L'\x04';
      goto LAB_0019981c;
    case 0x30:
      if (paVar35->el_info[0].res_level < 1) {
        paVar35->el_info[0].res_level = 1;
        file_putf(log_file,"Adding resistance to %s\n",projections->name);
      }
      if (paVar35->el_info[1].res_level < 1) {
        paVar35->el_info[1].res_level = 1;
        file_putf(log_file,"Adding resistance to %s\n",projections[1].name);
      }
      if (paVar35->el_info[2].res_level < 1) {
        paVar35->el_info[2].res_level = 1;
        file_putf(log_file,"Adding resistance to %s\n",projections[2].name);
      }
      if (paVar35->el_info[3].res_level < 1) {
        paVar35->el_info[3].res_level = 1;
        pcVar14 = projections[3].name;
LAB_00199bf9:
        pcVar15 = "Adding resistance to %s\n";
        goto LAB_00199c00;
      }
      break;
    case 0x31:
      lVar16 = 0;
      uVar6 = 0;
      do {
        uVar6 = uVar6 + data->art_probs[*(short *)((long)art_idx_high_resist + lVar16)];
        lVar16 = lVar16 + 2;
      } while (lVar16 != 0x1a);
      bVar36 = false;
      uVar25 = 0;
      do {
        uVar9 = Rand_div(uVar6);
        uVar6 = data->art_probs[0x42];
        uVar18 = 0;
        if ((int)uVar6 <= (int)uVar9) {
          piVar30 = art_idx_high_resist;
          uVar28 = uVar18;
          do {
            uVar6 = uVar6 + data->art_probs[*piVar30];
            uVar18 = uVar28 + 1;
            if (0xb < uVar28) break;
            piVar30 = piVar30 + 1;
            uVar28 = uVar18;
          } while ((int)uVar6 <= (int)uVar9);
        }
        switch(uVar18) {
        case 0:
          sVar26 = paVar35->el_info[4].res_level;
          if (sVar26 < 1) {
            paVar35->el_info[4].res_level = 1;
            pcVar14 = projections[4].name;
LAB_001996a0:
            file_putf(log_file,"Adding resistance to %s\n",pcVar14);
          }
          break;
        case 1:
          wVar7 = L'\x06';
          goto LAB_00199604;
        case 2:
          sVar26 = paVar35->el_info[5].res_level;
          if (sVar26 < 1) {
            paVar35->el_info[5].res_level = 1;
            pcVar14 = projections[5].name;
            goto LAB_001996a0;
          }
          break;
        case 3:
          sVar26 = paVar35->el_info[6].res_level;
          if (sVar26 < 1) {
            paVar35->el_info[6].res_level = 1;
            pcVar14 = projections[6].name;
            goto LAB_001996a0;
          }
          break;
        case 4:
          wVar7 = L'\a';
          goto LAB_00199604;
        case 5:
          wVar7 = L'\b';
          goto LAB_00199604;
        case 6:
          sVar26 = paVar35->el_info[7].res_level;
          if (sVar26 < 1) {
            paVar35->el_info[7].res_level = 1;
            pcVar14 = projections[7].name;
            goto LAB_001996a0;
          }
          break;
        case 7:
          sVar26 = paVar35->el_info[8].res_level;
          if (sVar26 < 1) {
            paVar35->el_info[8].res_level = 1;
            pcVar14 = projections[8].name;
            goto LAB_001996a0;
          }
          break;
        case 8:
          sVar26 = paVar35->el_info[9].res_level;
          if (sVar26 < 1) {
            paVar35->el_info[9].res_level = 1;
            pcVar14 = projections[9].name;
            goto LAB_001996a0;
          }
          break;
        case 9:
          sVar26 = paVar35->el_info[10].res_level;
          if (sVar26 < 1) {
            paVar35->el_info[10].res_level = 1;
            pcVar14 = projections[10].name;
            goto LAB_001996a0;
          }
          break;
        case 10:
          sVar26 = paVar35->el_info[0xb].res_level;
          if (sVar26 < 1) {
            paVar35->el_info[0xb].res_level = 1;
            pcVar14 = projections[0xb].name;
            goto LAB_001996a0;
          }
          break;
        case 0xb:
          sVar26 = paVar35->el_info[0xc].res_level;
          if (sVar26 < 1) {
            paVar35->el_info[0xc].res_level = 1;
            pcVar14 = projections[0xc].name;
            goto LAB_001996a0;
          }
          break;
        case 0xc:
          wVar7 = L'\t';
LAB_00199604:
          bVar36 = add_flag(paVar35,wVar7);
        default:
          goto switchD_0019949e_default;
        }
        bVar36 = sVar26 < 1;
switchD_0019949e_default:
      } while ((bVar36 == false) && (bVar3 = uVar25 < 199, uVar25 = uVar25 + 1, bVar3));
      break;
    case 0x32:
      wVar7 = Rand_div(5);
      goto LAB_0019981c;
    case 0x33:
      _Var4 = flags_test_all(flags1,5,1,2,3,4,5,0);
      if (!_Var4) {
        _Var4 = false;
        do {
          uVar6 = Rand_div(5);
          if (uVar6 < 5) {
            _Var4 = add_flag(paVar35,uVar6 + L'\x01');
          }
        } while (_Var4 == false);
      }
      break;
    case 0x35:
      wVar7 = L'\x06';
      goto LAB_0019981c;
    case 0x36:
      wVar7 = L'\a';
      goto LAB_0019981c;
    case 0x38:
      uVar6 = Rand_div(4);
      paVar35->el_info[(int)uVar6].res_level = 3;
      pcVar14 = projections[(int)uVar6].name;
      pcVar15 = "Adding immunity to %s\n";
LAB_00199c00:
      file_putf(log_file,pcVar15,pcVar14);
      break;
    case 0x3c:
      if (paVar35->tval != L'\x13') {
        paVar35->modifiers[0xd] = L'\x01';
      }
      break;
    case 0x3f:
      wVar7 = L'\n';
      goto LAB_00199736;
    case 0x40:
      wVar7 = L'\f';
      goto LAB_00199736;
    case 0x42:
      if (paVar35->el_info[4].res_level < 1) {
        paVar35->el_info[4].res_level = 1;
        pcVar14 = projections[4].name;
        goto LAB_00199bf9;
      }
      break;
    case 0x43:
      wVar7 = L'\x06';
      goto LAB_00199736;
    case 0x44:
      if (paVar35->el_info[5].res_level < 1) {
        paVar35->el_info[5].res_level = 1;
        pcVar14 = projections[5].name;
        goto LAB_00199bf9;
      }
      break;
    case 0x45:
      if (paVar35->el_info[6].res_level < 1) {
        paVar35->el_info[6].res_level = 1;
        pcVar14 = projections[6].name;
        goto LAB_00199bf9;
      }
      break;
    case 0x47:
      wVar7 = L'\b';
      goto LAB_00199736;
    case 0x48:
      if (paVar35->el_info[7].res_level < 1) {
        paVar35->el_info[7].res_level = 1;
        pcVar14 = projections[7].name;
        goto LAB_00199bf9;
      }
      break;
    case 0x49:
      if (paVar35->el_info[8].res_level < 1) {
        paVar35->el_info[8].res_level = 1;
        pcVar14 = projections[8].name;
        goto LAB_00199bf9;
      }
      break;
    case 0x4a:
      if (paVar35->el_info[9].res_level < 1) {
        paVar35->el_info[9].res_level = 1;
        pcVar14 = projections[9].name;
        goto LAB_00199bf9;
      }
      break;
    case 0x4b:
      if (paVar35->el_info[10].res_level < 1) {
        paVar35->el_info[10].res_level = 1;
        pcVar14 = projections[10].name;
        goto LAB_00199bf9;
      }
      break;
    case 0x4c:
      if (paVar35->el_info[0xb].res_level < 1) {
        paVar35->el_info[0xb].res_level = 1;
        pcVar14 = projections[0xb].name;
        goto LAB_00199bf9;
      }
      break;
    case 0x4d:
      if (paVar35->el_info[0xc].res_level < 1) {
        paVar35->el_info[0xc].res_level = 1;
        pcVar14 = projections[0xc].name;
        goto LAB_00199bf9;
      }
      break;
    case 0x50:
      if ((paVar35->activation == (activation *)0x0) && (poVar19->activation == (activation *)0x0))
      {
        add_activation(paVar35,wVar12,data->max_power);
      }
      break;
    case 0x51:
      wVar7 = L'\t';
LAB_00199736:
      add_flag(paVar35,wVar7);
      break;
    case 0x52:
      wVar7 = L'\x0e';
LAB_0019981c:
      add_mod(paVar35,wVar7);
      break;
    case 0x55:
    case 0x56:
      if (300 < (uint)wVar12) {
        wVar7 = L'\x1a';
        goto LAB_00199736;
      }
    }
    remove_contradictory(paVar35);
    if ((paVar35->modifiers[2] != L'\0') && ((paVar35->tval & 0xfffffffeU) == 8)) {
      add_flag(paVar35,L'\x12');
    }
    remove_contradictory(paVar35);
    wVar7 = artifact_power(*aidx,"artifact attempt",verbose_00);
    if (wVar7 < L'\0') {
      wVar7 = -wVar7;
      goto LAB_00199c1a;
    }
    if (uVar10 != 0) {
      uVar6 = Rand_div(2);
      file_putf(log_file,"Make it bad:\n");
      file_putf(log_file,"   ");
      uVar9 = Rand_div(7);
      if (uVar9 == 0) {
        flag_on_dbg(flags1,5,0x1a,"art->flags","OF_AGGRAVATE");
        file_putf(log_file," aggravate,");
      }
      uVar9 = Rand_div(4);
      if (uVar9 == 0) {
        flag_on_dbg(flags1,5,0x1b,"art->flags","OF_DRAIN_EXP");
        file_putf(log_file," drain xp,");
      }
      uVar9 = Rand_div(7);
      if (uVar9 == 0) {
        flag_on_dbg(flags1,5,0x19,"art->flags","OF_NO_TELEPORT");
        file_putf(log_file," no tele,");
      }
      uVar25 = uVar6 + 1;
      uVar32 = 0;
      lVar16 = 0x14;
      uVar18 = 0;
      do {
        if (0 < *(int *)(paVar35->flags + lVar16 * 4 + -0x48)) {
          uVar18 = (ulong)((int)uVar18 + 1);
          uVar6 = Rand_div(2);
          if ((lVar16 != 0x20) && (uVar6 == 0)) {
            *(int *)(paVar35->flags + lVar16 * 4 + -0x48) =
                 -*(int *)(paVar35->flags + lVar16 * 4 + -0x48);
            uVar32 = uVar32 + 1;
          }
        }
        lVar16 = lVar16 + 1;
      } while (lVar16 != 0x24);
      file_putf(log_file," flip %d of %d modifiers,",(ulong)uVar32,uVar18);
      if ((L'\0' < paVar35->to_a) && (uVar6 = Rand_div(2), uVar6 == 0)) {
        paVar35->to_a = -paVar35->to_a;
        file_putf(log_file," flip ac,");
      }
      if ((L'\0' < paVar35->to_h) && (uVar6 = Rand_div(2), uVar6 == 0)) {
        paVar35->to_h = -paVar35->to_h;
        file_putf(log_file," flip to-hit,");
      }
      if ((L'\0' < paVar35->to_d) && (uVar6 = Rand_div(4), uVar6 == 0)) {
        paVar35->to_d = -paVar35->to_d;
        file_putf(log_file," flip to-dam,");
      }
      if (uVar25 == 0) {
        uVar32 = 0;
      }
      else {
        uVar32 = 0;
        uVar27 = uVar25;
        do {
          _Var4 = flag_has_dbg(flags1,5,0x12,"art->flags","OF_BLESSED");
          uVar33 = 0;
          if (!_Var4) {
            for (iVar8 = 5; iVar8 != 0; iVar8 = iVar8 + -1) {
              uVar6 = Rand_div(z_info->curse_max - 1);
              uVar9 = Rand_div(9);
              iVar5 = m_bonus(9,local_364);
              if (curses[uVar6 + L'\x01'].poss[paVar35->tval] != false) {
                _Var4 = append_artifact_curse(paVar35,uVar6 + L'\x01',uVar9 + iVar5 * 10 + L'\x01');
                uVar33 = (uint)_Var4;
                goto LAB_00199b43;
              }
            }
            uVar33 = 0;
          }
LAB_00199b43:
          uVar32 = uVar32 + uVar33;
          uVar27 = uVar27 - 1;
        } while (uVar27 != 0);
      }
      file_putf(log_file," %d of %d curses applied\n",(ulong)uVar32,(ulong)uVar25);
      uVar6 = Rand_div(3);
      if (uVar6 == 0) {
        uVar10 = 0;
      }
    }
    if (wVar24 < wVar7) {
      copy_artifact(a_dst,paVar35);
      file_putf(log_file,"--- Too powerful!  Rolling back.\n");
    }
    else if (local_330 <= wVar7) goto LAB_00199c1a;
    uVar11 = uVar11 + 1;
  } while (uVar11 != 200);
  uVar11 = 200;
LAB_00199c1a:
  if (199 < uVar11) {
    file_putf(log_file,"Warning!  Couldn\'t get appropriate power level on artifact.\n");
  }
  mem_free(a_dst->slays);
  mem_free(a_dst->brands);
  mem_free(a_dst->curses);
  mem_free(a_dst);
  wVar22 = L'\x14';
  if (poVar13->alloc_prob != L'\0') {
    wVar22 = poVar13->alloc_prob;
  }
  wVar24 = (wchar_t)((long)(4000000 / (ulong)(uint)(wVar7 * wVar7)) / (long)wVar22);
  wVar22 = L'c';
  if (wVar24 < L'c') {
    wVar22 = wVar24;
  }
  wVar24 = L'\x01';
  if (L'\x01' < wVar22) {
    wVar24 = wVar22;
  }
  paVar35->alloc_prob = wVar24;
  wVar22 = L'\x7f';
  if (wVar7 < L'Ô') {
    wVar22 = (wVar7 * 3) / 5;
  }
  paVar35->alloc_max = wVar22;
  wVar24 = (wVar7 * 100 + 10000) / data->max_power;
  wVar22 = L'd';
  if (wVar24 < L'd') {
    wVar22 = wVar24;
  }
  paVar35->alloc_min = wVar22;
  uVar9 = (uint)wVar12 / 0x14 + 5;
  uVar6 = Rand_div(uVar9);
  if (uVar6 == 0) {
    uVar6 = Rand_div(0x14);
    wVar22 = uVar6 + paVar35->alloc_prob + L'\x01';
    wVar12 = L'c';
    if (wVar22 < L'c') {
      wVar12 = wVar22;
    }
    paVar35->alloc_prob = wVar12;
  }
  else {
    uVar6 = Rand_div(uVar9);
    if (uVar6 == 0) {
      wVar12 = L'\x01';
      if (L'\x01' < paVar35->alloc_min) {
        wVar12 = paVar35->alloc_min / 2;
      }
      paVar35->alloc_min = wVar12;
    }
  }
  wVar12 = paVar35->alloc_min;
  wVar22 = L'\x7f';
  if (wVar12 < L'@') {
    wVar22 = wVar12 * 2;
  }
  if (wVar22 < paVar35->alloc_max) {
    wVar22 = paVar35->alloc_max;
  }
  paVar35->alloc_max = wVar22;
  if (((paVar35->activation == (activation *)0x0) && (poVar13->activation == (activation *)0x0)) &&
     (poVar13->effect == (effect *)0x0)) {
    paVar35->level = wVar12;
  }
  file_putf(log_file,"New depths are min %d, max %d\n");
  file_putf(log_file,"Power-based alloc_prob is %d\n",(ulong)(uint)paVar35->alloc_prob);
  file_putf(log_file,"<<<<<<<<<<<<<<<<<<<<<<<<<< ARTIFACT COMPLETED\n");
  file_putf(log_file,"Number of tries for artifact %d was: %d\n",(ulong)(uint)*aidx,(ulong)uVar11);
  paVar35 = a_info;
  iVar8 = *aidx;
  pcVar14 = "Random ";
  piVar17 = local_328;
  for (lVar16 = 0x10; lVar16 != 0; lVar16 = lVar16 + -1) {
    *(undefined8 *)piVar17 = *(undefined8 *)pcVar14;
    pcVar14 = pcVar14 + ((ulong)bVar37 * -2 + 1) * 8;
    piVar17 = piVar17 + (ulong)bVar37 * -4 + 2;
  }
  pcVar14 = tval_find_name(a_info[iVar8].tval);
  my_strcat((char *)local_328,pcVar14,0x80);
  pcVar14 = format(" of power %d",(ulong)(uint)wVar7);
  my_strcat((char *)local_328,pcVar14,0x80);
  string_free(paVar35[iVar8].text);
  pcVar14 = string_make((char *)local_328);
  paVar35[iVar8].text = pcVar14;
  return;
}

Assistant:

static void design_artifact(struct artifact_set_data *data, int tv, int *aidx)
{
	struct artifact *art = &a_info[*aidx];
	struct object_kind *kind = lookup_kind(art->tval, art->sval);
	int art_freq[ART_IDX_TOTAL];
	int art_level = art->level;
	int tries;
	int alloc_new;
	int ap = 0;
	bool hurt_me = false;

	/* Set tval if necessary */
	int tval = (tv == TV_NULL) ? get_base_item_tval(data) : tv;

	/* Structure to hold the old artifact */
	struct artifact *a_old = mem_zalloc(sizeof *a_old);

	/* Choose a power for the artifact */
	int power = Rand_sample(data->avg_tv_power[tval],
							data->max_tv_power[tval],
							data->min_tv_power[tval],
							20, 20);

	/* Choose a name */
	char *new_name = artifact_gen_name(art, name_sections);

	/* Skip fixed artifacts */
	while (strstr(art->name, "The One Ring") ||
		kf_has(kind->kind_flags, KF_QUEST_ART)) {
		(*aidx)++;
		if ((*aidx) >= z_info->a_max) {
			string_free(new_name);
			mem_free(a_old);
			return;
		}
		art = &a_info[*aidx];
		art_level = art->level;
	}

	/* Apply the new name */
	string_free(art->name);
	art->name = new_name;

	file_putf(log_file, ">>>>>>>>>>>>>>>>>>>>>>>>>> CREATING NEW ARTIFACT\n");
	file_putf(log_file, "Artifact %d: power = %d\n", *aidx, power);

	/* Flip the sign on power if it's negative (unlikely) and damage */
	if (power < 0) {
		hurt_me = true;
		power = -power;
	}

	/* Choose a base item typen not too powerful, so we'll have to add to it. */
	for (tries = 0; tries < MAX_TRIES; tries++) {
		int base_power = 0;

		/* Get the new item kind and do basic prep on it */
		if (tval == TV_NULL) {
			tval = get_base_item_tval(data);
		}
		kind = get_base_item(data, tval);
		artifact_prep(art, kind, data);

		/* Get the kind again in case it's changed */
		kind = lookup_kind(art->tval, art->sval);

		base_power = artifact_power(*aidx, "for base item power", true);
		file_putf(log_file, "Base item power %d\n", base_power);

		/* New base item power too close to target artifact power */
		if ((base_power > (power * 6) / 10 + 1) && (power - base_power < 20)) {
			file_putf(log_file, "Power too high!\n");
			continue;
		}

		/* Acceptable */
		break;
	};

	/* Failed to get a good base item */
	if (tries >= MAX_TRIES)
		file_putf(log_file, "Warning! Couldn't get appropriate power level on base item.\n");

	/* Generate the cumulative frequency table for this base item type */
	build_freq_table(art, art_freq, data);

	/* Copy artifact info temporarily. */
	copy_artifact(art, a_old);

	/* Give this artifact a shot at being supercharged */
	try_supercharge(art, power, data);
	ap = artifact_power(*aidx, "result of supercharge", true);
	if (ap > (power * 23) / 20 + 1)	{
		/* Too powerful -- put it back */
		copy_artifact(a_old, art);
		file_putf(log_file, "--- Supercharge is too powerful! Rolling back.\n");
	}

	/* Give this artifact a chance to be cursed - note it retains its power */
	if (one_in_(z_info->a_max / MAX(2, data->neg_power_total))) {
		hurt_me = true;
	}

	/* Do the actual artifact design */
	for (tries = 0; tries < MAX_TRIES; tries++) {
		/* Copy artifact info temporarily. */
		copy_artifact(art, a_old);

		/* Add an ability */
		add_ability(art, power, art_freq, data);
		remove_contradictory(art);

		/* Check the power, handle negative power */
		ap = artifact_power(*aidx, "artifact attempt", true);
		if (ap < 0) {
			ap = -ap;
			break;
		}

		/* Curse the designated artifacts */
		if (hurt_me) {
			make_bad(art, art_level);
			if (one_in_(3)) {
				hurt_me = false;
			}
		}

		/* Check power */
		if (ap > (power * 23) / 20 + 1) {
			/* Too powerful -- put it back */
			copy_artifact(a_old, art);
			file_putf(log_file, "--- Too powerful!  Rolling back.\n");
			continue;
		} else if (ap >= (power * 19) / 20) {
			/* Just right */
			break;
		}
	}

	/* Couldn't generate an artifact with the number of permitted iterations */
	if (tries >= MAX_TRIES)
		file_putf(log_file, "Warning!  Couldn't get appropriate power level on artifact.\n");

	/* Cleanup a_old */
	mem_free(a_old->slays);
	mem_free(a_old->brands);
	mem_free(a_old->curses);
	mem_free(a_old);

	/* Set rarity based on power */
	alloc_new = 4000000 / (ap * ap);
	alloc_new /= (kind->alloc_prob ? kind->alloc_prob : 20);
	if (alloc_new > 99) alloc_new = 99;
	if (alloc_new < 1) alloc_new = 1;
	art->alloc_prob = alloc_new;


	/* Set depth according to power */
	art->alloc_max = MIN(127, (ap * 3) / 5);
	art->alloc_min = MIN(100, ((ap + 100) * 100 / data->max_power));

	/* Have a chance to be less rare or deep, more likely the less power */
	if (one_in_(5 + (power / 20))) {
		art->alloc_prob += randint1(20);
		if (art->alloc_prob > 99) art->alloc_prob = 99;
	} else if (one_in_(5 + (power / 20))) {
		art->alloc_min /= 2;
		if (art->alloc_min < 1) art->alloc_min = 1;
	}

	/* Sanity check */
	art->alloc_max = MAX(art->alloc_max, MIN(art->alloc_min * 2, 127));

	/*
	 * If there is no activation or effect from the kind, level currently
	 * does nothing.  Set it to alloc_min in case changes elsewhere start
	 * using level for the artifact.
	 */
	if (!art->activation && !kind->activation && !kind->effect) {
		art->level = art->alloc_min;
	}

	file_putf(log_file, "New depths are min %d, max %d\n", art->alloc_min,
			  art->alloc_max);
	file_putf(log_file, "Power-based alloc_prob is %d\n", art->alloc_prob);

	/* Success */
	file_putf(log_file, "<<<<<<<<<<<<<<<<<<<<<<<<<< ARTIFACT COMPLETED\n");
	file_putf(log_file, "Number of tries for artifact %d was: %d\n", *aidx,
			  tries);

	/* Describe it */
	describe_artifact(*aidx, ap);
}